

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O0

int sharedstringlist_add_buffer(sharedstringlist *sharedstrings,XML_Char *data,size_t datalen)

{
  size_t sVar1;
  XML_Char **ppXVar2;
  XML_Char **p;
  XML_Char *s;
  size_t datalen_local;
  XML_Char *data_local;
  sharedstringlist *sharedstrings_local;
  
  if (sharedstrings == (sharedstringlist *)0x0) {
    sharedstrings_local._4_4_ = 1;
  }
  else {
    if (data == (XML_Char *)0x0) {
      p = (XML_Char **)0x0;
    }
    else {
      p = (XML_Char **)malloc(datalen + 1);
      if (p == (XML_Char **)0x0) {
        return 2;
      }
      memcpy(p,data,datalen);
      *(undefined1 *)((long)p + datalen) = 0;
    }
    ppXVar2 = (XML_Char **)realloc(sharedstrings->strings,(sharedstrings->numstrings + 1) * 8);
    if (ppXVar2 == (XML_Char **)0x0) {
      free(p);
      sharedstrings_local._4_4_ = 3;
    }
    else {
      sharedstrings->strings = ppXVar2;
      sVar1 = sharedstrings->numstrings;
      sharedstrings->numstrings = sVar1 + 1;
      sharedstrings->strings[sVar1] = (XML_Char *)p;
      sharedstrings_local._4_4_ = 0;
    }
  }
  return sharedstrings_local._4_4_;
}

Assistant:

int sharedstringlist_add_buffer (struct sharedstringlist* sharedstrings, const XML_Char* data, size_t datalen)
{
  XML_Char* s;
  XML_Char** p;
  if (!sharedstrings)
    return 1;
  if (!data) {
    s = NULL;
  } else {
    if ((s = XML_Char_malloc(datalen + 1)) == NULL)
      return 2;
    XML_Char_poscpy(s, 0, data, datalen);
    s[datalen] = 0;
  }
  if ((p = (XML_Char**)realloc(sharedstrings->strings, (sharedstrings->numstrings + 1) * sizeof(sharedstrings->strings[0]))) == NULL) {
    free(s);
    return 3;
  }
  sharedstrings->strings = p;
  sharedstrings->strings[sharedstrings->numstrings++] = s;
  return 0;
}